

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslayoutitem.cpp
# Opt level: O2

void __thiscall QGraphicsLayoutItem::~QGraphicsLayoutItem(QGraphicsLayoutItem *this)

{
  QGraphicsLayoutItem *pQVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  QGraphicsLayoutItemPrivate *pQVar4;
  QGraphicsLayout *lay;
  
  this->_vptr_QGraphicsLayoutItem = (_func_int **)&PTR__QGraphicsLayoutItem_007ecf50;
  pQVar4 = (this->d_ptr).d;
  pQVar1 = pQVar4->parent;
  if (pQVar1 != (QGraphicsLayoutItem *)0x0) {
    if ((((pQVar1->d_ptr).d)->field_0xb0 & 4) != 0) {
      uVar2 = (*pQVar1->_vptr_QGraphicsLayoutItem[9])(pQVar1);
      do {
        if ((int)uVar2 < 1) goto LAB_0058bb4b;
        uVar2 = uVar2 - 1;
        iVar3 = (*pQVar1->_vptr_QGraphicsLayoutItem[10])(pQVar1,(ulong)uVar2);
      } while ((QGraphicsLayoutItem *)CONCAT44(extraout_var,iVar3) != this);
      (*pQVar1->_vptr_QGraphicsLayoutItem[0xb])(pQVar1,(ulong)uVar2);
    }
LAB_0058bb4b:
    pQVar4 = (this->d_ptr).d;
    if (pQVar4 == (QGraphicsLayoutItemPrivate *)0x0) {
      return;
    }
  }
  (*pQVar4->_vptr_QGraphicsLayoutItemPrivate[1])();
  return;
}

Assistant:

QGraphicsLayoutItem::~QGraphicsLayoutItem()
{
    QGraphicsLayoutItem *parentLI = parentLayoutItem();
    if (parentLI && parentLI->isLayout()) {
        QGraphicsLayout *lay = static_cast<QGraphicsLayout*>(parentLI);
        // this is not optimal
        for (int i = lay->count() - 1; i >= 0; --i) {
            if (lay->itemAt(i) == this) {
                lay->removeAt(i);
                break;
            }
        }
    }
}